

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.hpp
# Opt level: O0

void __thiscall
rsg::VariableAccess::tokenize(VariableAccess *this,GeneratorState *state,TokenStream *str)

{
  char *identifier;
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  VariableAccess *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  identifier = Variable::getName(this->m_variable);
  Token::Token(&local_30,identifier);
  TokenStream::operator<<(str,&local_30);
  Token::~Token(&local_30);
  return;
}

Assistant:

void						tokenize			(GeneratorState& state, TokenStream& str) const	{ DE_UNREF(state); str << Token(m_variable->getName());	}